

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_cluster_listen_accept(intptr_t uuid,fio_protocol_s *protocol)

{
  fio_lock_i fVar1;
  void *uuid_;
  fio_protocol_s *protocol_;
  fio_ls_s *pfVar2;
  int *piVar3;
  timespec local_48;
  
  uuid_ = (void *)fio_accept(uuid);
  while( true ) {
    if (uuid_ == (void *)0xffffffffffffffff) {
      return;
    }
    protocol_ = fio_cluster_protocol_alloc
                          ((intptr_t)uuid_,fio_cluster_server_handler,fio_cluster_server_sender);
    fio_attach__internal(uuid_,protocol_);
    LOCK();
    UNLOCK();
    local_48.tv_sec._0_1_ = cluster_data.lock;
    while (cluster_data.lock = '\x01', (fio_lock_i)local_48.tv_sec != '\0') {
      local_48.tv_sec = 0;
      local_48.tv_nsec = 1;
      nanosleep(&local_48,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_48.tv_sec._0_1_ = cluster_data.lock;
    }
    pfVar2 = (fio_ls_s *)calloc(0x18,1);
    if (pfVar2 == (fio_ls_s *)0x0) break;
    pfVar2->prev = cluster_data.clients.prev;
    pfVar2->next = &cluster_data.clients;
    pfVar2->obj = uuid_;
    (cluster_data.clients.prev)->next = pfVar2;
    fVar1 = cluster_data.lock;
    LOCK();
    cluster_data.lock = '\0';
    UNLOCK();
    local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,fVar1);
    cluster_data.clients.prev = pfVar2;
    uuid_ = (void *)fio_accept(uuid);
  }
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR(
                  "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
                  );
  }
  kill(0,2);
  piVar3 = __errno_location();
  exit(*piVar3);
}

Assistant:

static void fio_cluster_listen_accept(intptr_t uuid, fio_protocol_s *protocol) {
  (void)protocol;
  /* prevent `accept` backlog in parent */
  intptr_t client;
  while ((client = fio_accept(uuid)) != -1) {
    fio_attach(client,
               fio_cluster_protocol_alloc(client, fio_cluster_server_handler,
                                          fio_cluster_server_sender));
    fio_lock(&cluster_data.lock);
    fio_ls_push(&cluster_data.clients, (void *)client);
    fio_unlock(&cluster_data.lock);
  }
}